

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_transaction.cpp
# Opt level: O2

bool __thiscall
cfd::TransactionContext::VerifyInputSchnorrSignature
          (TransactionContext *this,SchnorrSignature *signature,OutPoint *outpoint,
          vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *utxo_list,SchnorrPubkey *pubkey,
          ByteData *annex)

{
  uint32_t uVar1;
  pointer pUVar2;
  char cVar3;
  bool bVar4;
  undefined1 uVar5;
  uint uVar6;
  uint32_t uVar7;
  undefined4 uVar8;
  CfdException *pCVar9;
  long lVar10;
  pointer utxo;
  ByteData256 sighash;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_5a0;
  vector<cfd::UtxoData,_std::allocator<cfd::UtxoData>_> *local_588;
  long local_580;
  long local_578;
  ByteData hash;
  vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_> utxos;
  undefined1 local_52c [12];
  UtxoData target_utxo;
  
  local_588 = utxo_list;
  UtxoData::UtxoData(&target_utxo);
  utxos.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  utxos.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  utxos.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::reserve
            (&utxos,(*(long *)&this->field_0x18 - *(long *)&this->field_0x10) / 0x90);
  local_580 = *(long *)&this->field_0x18;
  for (lVar10 = *(long *)&this->field_0x10; lVar10 != local_580; lVar10 = lVar10 + 0x90) {
    cfd::core::AbstractTxIn::GetTxid();
    uVar6 = cfd::core::AbstractTxIn::GetVout();
    cfd::core::OutPoint::OutPoint((OutPoint *)&hash,(Txid *)&sighash,uVar6);
    core::Txid::~Txid((Txid *)&sighash);
    pUVar2 = (local_588->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar4 = false;
    local_578 = lVar10;
    for (utxo = (local_588->super__Vector_base<cfd::UtxoData,_std::allocator<cfd::UtxoData>_>).
                _M_impl.super__Vector_impl_data._M_start; utxo != pUVar2; utxo = utxo + 1) {
      cfd::core::AbstractTxIn::GetTxid();
      cVar3 = cfd::core::Txid::Equals((Txid *)&sighash);
      if (cVar3 == '\0') {
        core::Txid::~Txid((Txid *)&sighash);
      }
      else {
        uVar7 = cfd::core::AbstractTxIn::GetVout();
        uVar1 = utxo->vout;
        core::Txid::~Txid((Txid *)&sighash);
        lVar10 = local_578;
        if (uVar7 == uVar1) {
          GetLockingScriptFromUtxoData((Script *)&sighash,utxo);
          std::vector<cfd::core::TxOut,std::allocator<cfd::core::TxOut>>::
          emplace_back<cfd::core::Amount_const&,cfd::core::Script&>
                    ((vector<cfd::core::TxOut,std::allocator<cfd::core::TxOut>> *)&utxos,
                     &utxo->amount,(Script *)&sighash);
          cVar3 = cfd::core::OutPoint::operator==(outpoint,(OutPoint *)&hash);
          if (cVar3 != '\0') {
            UtxoData::operator=(&target_utxo,utxo);
            cfd::core::Script::operator=(&target_utxo.locking_script,(Script *)&sighash);
          }
          core::Script::~Script((Script *)&sighash);
          bVar4 = true;
        }
      }
    }
    if (!bVar4) {
      pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&sighash,"Utxo is not found. VerifyInputSchnorrSignature fail.",
                 (allocator *)&local_5a0);
      core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&sighash);
      __cxa_throw(pCVar9,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Txid::~Txid((Txid *)&hash);
  }
  cVar3 = cfd::core::Amount::operator==(&target_utxo.amount,0);
  if (cVar3 != '\0') {
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&sighash,"OutPoint is not found into utxo_list.",(allocator *)&hash);
    core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&sighash);
    __cxa_throw(pCVar9,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  cVar3 = cfd::core::Script::IsTaprootScript();
  if (cVar3 != '\0') {
    cfd::core::Script::GetElementList();
    cfd::core::ScriptElement::GetBinaryData();
    std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
              ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
               &sighash);
    cfd::core::SchnorrPubkey::GetData();
    cVar3 = cfd::core::ByteData::Equals(&hash);
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
              ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
    if (cVar3 != '\0') {
      uVar8 = (**(code **)(*(long *)this + 0x78))(this,outpoint);
      cfd::core::SchnorrSignature::GetSigHashType();
      if (annex == (ByteData *)0x0) {
        cfd::core::ByteData::ByteData((ByteData *)&local_5a0);
      }
      else {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_5a0,&annex->data_
                  );
      }
      cfd::core::Transaction::GetSchnorrSignatureHash
                (&sighash,this,uVar8,local_52c,&utxos,0,&local_5a0);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_5a0);
      uVar5 = cfd::core::SchnorrPubkey::Verify((SchnorrSignature *)pubkey,(ByteData256 *)signature);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&sighash);
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&hash);
      std::vector<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>::~vector(&utxos);
      UtxoData::~UtxoData(&target_utxo);
      return (bool)uVar5;
    }
    pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&sighash,"Unmatch locking script.",(allocator *)&local_5a0);
    core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&sighash);
    __cxa_throw(pCVar9,&core::CfdException::typeinfo,core::CfdException::~CfdException);
  }
  pCVar9 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&sighash,"Target OutPoint is not taproot.",(allocator *)&hash);
  core::CfdException::CfdException(pCVar9,kCfdIllegalArgumentError,(string *)&sighash);
  __cxa_throw(pCVar9,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

bool TransactionContext::VerifyInputSchnorrSignature(
    const SchnorrSignature& signature, const OutPoint& outpoint,
    const std::vector<UtxoData>& utxo_list, const SchnorrPubkey& pubkey,
    const ByteData* annex) const {
  UtxoData target_utxo;
  std::vector<TxOut> utxos;
  utxos.reserve(vin_.size());
  for (const auto& txin_ref : vin_) {
    OutPoint target_outpoint(txin_ref.GetTxid(), txin_ref.GetVout());
    bool is_find = false;
    for (const auto& utxo : utxo_list) {
      if (txin_ref.GetTxid().Equals(utxo.txid) &&
          (txin_ref.GetVout() == utxo.vout)) {
        is_find = true;
        Script locking_script = GetLockingScriptFromUtxoData(utxo);
        utxos.emplace_back(utxo.amount, locking_script);

        if (outpoint == target_outpoint) {
          target_utxo = utxo;
          target_utxo.locking_script = locking_script;
        }
      }
    }
    if (!is_find) {
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Utxo is not found. VerifyInputSchnorrSignature fail.");
    }
  }
  if (target_utxo.amount == 0) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "OutPoint is not found into utxo_list.");
  } else if (!target_utxo.locking_script.IsTaprootScript()) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Target OutPoint is not taproot.");
  }
  auto hash = target_utxo.locking_script.GetElementList()[1].GetBinaryData();
  if (!hash.Equals(pubkey.GetData())) {
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Unmatch locking script.");
  }

  auto sighash = GetSchnorrSignatureHash(
      GetTxInIndex(outpoint), signature.GetSigHashType(), utxos, nullptr,
      (annex != nullptr) ? *annex : ByteData());
  return pubkey.Verify(signature, sighash);
}